

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedback::DrawXFBFeedback::DrawXFBFeedback
          (DrawXFBFeedback *this,Context *context,char *test_name,char *test_description)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,test_name,test_description);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawXFBFeedback_02107838;
  this->m_context = context;
  this->m_program_id = 0;
  this->m_xfb_id = 0;
  this->m_source_bo_index = 0;
  this->m_bo_id[0] = 0x1010101;
  this->m_bo_id[1] = 0x1010101;
  return;
}

Assistant:

gl3cts::TransformFeedback::DrawXFBFeedback::DrawXFBFeedback(deqp::Context& context, const char* test_name,
															const char* test_description)
	: deqp::TestCase(context, test_name, test_description)
	, m_context(context)
	, m_program_id(0)
	, m_xfb_id(0)
	, m_source_bo_index(0)
{
	memset(m_bo_id, 1, sizeof(m_bo_id));
	memset(m_bo_id, 1, sizeof(m_vao_id));
}